

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to4_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  int iVar21;
  void *pvVar22;
  void *pvVar23;
  long lVar24;
  void *pvVar25;
  void *pvVar26;
  void *pvVar27;
  long lVar28;
  uint *puVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  void *pvVar33;
  long lVar34;
  undefined4 uVar35;
  void *pvVar36;
  ulong uVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  int k;
  void *pvVar41;
  short tmp [6] [3];
  ulong local_118;
  void *local_108;
  void *local_100;
  void *local_f8;
  undefined1 local_a8 [64];
  size_t local_68;
  short asStack_5c [3];
  uint auStack_56 [9];
  
  iVar18 = cpu_support_x86_avx2();
  if (iVar18 != 0) {
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
              (kernel,kernel_tm_pack8,inch,outch,opt);
    return;
  }
  iVar18 = cpu_support_x86_xop();
  if (iVar18 != 0) {
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
              (kernel,kernel_tm_pack8,inch,outch,opt);
    return;
  }
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar27 = kernel->data;
    local_108 = (void *)local_a8._0_8_;
    local_118 = 0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_118;
        uVar20 = 0;
        pvVar25 = local_108;
        do {
          lVar24 = uVar20 * 9;
          cVar1 = *(char *)((long)pvVar27 + lVar24 + iVar18);
          cVar2 = *(char *)((long)pvVar27 + lVar24 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)pvVar27 + lVar24 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)pvVar27 + lVar24 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)pvVar27 + lVar24 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)pvVar27 + lVar24 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)pvVar27 + lVar24 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)pvVar27 + lVar24 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)pvVar27 + lVar24 + (long)iVar18 + 8);
          lVar24 = 4;
          do {
            sVar10 = *(short *)(&UNK_005183dc + lVar24);
            sVar11 = *(short *)(&UNK_005183de + lVar24);
            sVar12 = *(short *)((long)&DAT_005183e0 + lVar24);
            *(short *)((long)asStack_5c + lVar24) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1
            ;
            *(short *)((long)asStack_5c + lVar24 + 2) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar24 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar24 = lVar24 + 6;
          } while (lVar24 != 0x28);
          lVar24 = 0;
          pvVar19 = pvVar25;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar24 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar24 * 6);
            puVar29 = &DAT_005183e2;
            lVar31 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar29),ZEXT416(uVar13));
              uVar35 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar31 * 2) =
                   (short)uVar35 + auVar16._0_2_ + *(short *)((long)puVar29 + -2) * sVar10;
              lVar31 = lVar31 + 1;
              puVar29 = (uint *)((long)puVar29 + 6);
            } while (lVar31 != 6);
            lVar24 = lVar24 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar24 != 6);
          uVar20 = uVar20 + 1;
          pvVar25 = (void *)((long)pvVar25 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
        } while (uVar20 != (uint)inch);
      }
      local_118 = local_118 + 1;
      local_108 = (void *)((long)local_108 + local_68 * local_a8._16_8_);
    } while (local_118 != (uint)outch);
  }
  iVar18 = inch + 7;
  if (-1 < inch) {
    iVar18 = inch;
  }
  iVar21 = outch + 3;
  if (-1 < outch) {
    iVar21 = outch;
  }
  Mat::create(kernel_tm_pack8,iVar18 >> 3,0x24,iVar21 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    iVar18 = kernel_tm_pack8->w;
    pvVar25 = kernel_tm_pack8->data;
    sVar14 = kernel_tm_pack8->elemsize;
    sVar15 = kernel_tm_pack8->cstep;
    lVar32 = local_a8._16_8_ * local_68;
    pvVar39 = (void *)(lVar32 * 3 + local_a8._0_8_);
    lVar24 = lVar32 * 4;
    lVar31 = (long)(int)local_a8._44_4_ * local_a8._16_8_ * 8;
    pvVar27 = (void *)(local_a8._0_8_ + lVar32 * 2);
    pvVar33 = (void *)(lVar32 + local_a8._0_8_);
    uVar20 = 0;
    pvVar19 = (void *)local_a8._0_8_;
    do {
      lVar32 = 0;
      pvVar26 = pvVar27;
      pvVar40 = pvVar39;
      local_100 = pvVar33;
      local_f8 = pvVar19;
      do {
        if (7 < inch) {
          lVar30 = (long)pvVar25 + (long)iVar18 * sVar14 * lVar32 + (uVar20 >> 2) * sVar15 * sVar14;
          pvVar22 = local_f8;
          pvVar23 = local_100;
          lVar34 = 0;
          pvVar36 = pvVar40;
          pvVar41 = pvVar26;
          do {
            lVar28 = 0;
            lVar38 = 0;
            do {
              *(undefined2 *)(lVar30 + lVar28) = *(undefined2 *)((long)pvVar22 + lVar38);
              *(undefined2 *)(lVar30 + lVar28 + 2) = *(undefined2 *)((long)pvVar23 + lVar38);
              *(undefined2 *)(lVar30 + lVar28 + 4) = *(undefined2 *)((long)pvVar41 + lVar38);
              *(undefined2 *)(lVar30 + lVar28 + 6) = *(undefined2 *)((long)pvVar36 + lVar38);
              lVar38 = lVar38 + (long)(int)local_a8._44_4_ * local_a8._16_8_;
              lVar28 = lVar28 + 8;
            } while (lVar28 != 0x40);
            lVar28 = lVar34 + 0xf;
            pvVar36 = (void *)((long)pvVar36 + lVar31);
            pvVar41 = (void *)((long)pvVar41 + lVar31);
            pvVar23 = (void *)((long)pvVar23 + lVar31);
            pvVar22 = (void *)((long)pvVar22 + lVar31);
            lVar30 = lVar30 + 0x40;
            lVar34 = lVar34 + 8;
          } while (lVar28 < inch);
        }
        lVar32 = lVar32 + 1;
        pvVar40 = (void *)((long)pvVar40 + 2);
        pvVar26 = (void *)((long)pvVar26 + 2);
        local_100 = (void *)((long)local_100 + 2);
        local_f8 = (void *)((long)local_f8 + 2);
      } while (lVar32 != 0x24);
      uVar37 = uVar20 + 7;
      pvVar39 = (void *)((long)pvVar39 + lVar24);
      pvVar27 = (void *)((long)pvVar27 + lVar24);
      pvVar33 = (void *)((long)pvVar33 + lVar24);
      pvVar19 = (void *)((long)pvVar19 + lVar24);
      uVar20 = uVar20 + 4;
    } while (uVar37 < (uint)outch);
  }
  piVar17 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx512vnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avxvnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8.create(inch / 8, 36, outch / 4, (size_t)2u * 32, 32);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel_tm.channel(q);
        const Mat k1 = kernel_tm.channel(q + 1);
        const Mat k2 = kernel_tm.channel(q + 2);
        const Mat k3 = kernel_tm.channel(q + 3);

        Mat kernel_tm = kernel_tm_pack8.channel(q / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = kernel_tm.row<short>(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
#if __AVXVNNI__ || __AVX512VNNI__ || __XOP__
                for (int i = 0; i < 4; i++)
                {
                    const short* k00 = k0.row<const short>(p + i * 2);
                    const short* k10 = k1.row<const short>(p + i * 2);
                    const short* k20 = k2.row<const short>(p + i * 2);
                    const short* k30 = k3.row<const short>(p + i * 2);

                    const short* k01 = k0.row<const short>(p + i * 2 + 1);
                    const short* k11 = k1.row<const short>(p + i * 2 + 1);
                    const short* k21 = k2.row<const short>(p + i * 2 + 1);
                    const short* k31 = k3.row<const short>(p + i * 2 + 1);

                    g00[0] = k00[k];
                    g00[1] = k01[k];
                    g00[2] = k10[k];
                    g00[3] = k11[k];
                    g00[4] = k20[k];
                    g00[5] = k21[k];
                    g00[6] = k30[k];
                    g00[7] = k31[k];

                    g00 += 8;
                }
#else
                for (int i = 0; i < 8; i++)
                {
                    const short* k00 = k0.row<const short>(p + i);
                    const short* k10 = k1.row<const short>(p + i);
                    const short* k20 = k2.row<const short>(p + i);
                    const short* k30 = k3.row<const short>(p + i);

                    g00[0] = k00[k];
                    g00[1] = k10[k];
                    g00[2] = k20[k];
                    g00[3] = k30[k];

                    g00 += 4;
                }
#endif
            }
        }
    }
}